

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbMan.c
# Opt level: O1

void Rsb_ManFree(Rsb_Man_t *p)

{
  Vec_Wrd_t *__ptr;
  Vec_Int_t *pVVar1;
  
  __ptr = p->vCexes;
  if (__ptr->pArray != (word *)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (word *)0x0;
  }
  if (__ptr != (Vec_Wrd_t *)0x0) {
    free(__ptr);
  }
  pVVar1 = p->vDecPats;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vFanins;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vFaninsOld;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  pVVar1 = p->vTries;
  if (pVVar1->pArray != (int *)0x0) {
    free(pVVar1->pArray);
    pVVar1->pArray = (int *)0x0;
  }
  if (pVVar1 != (Vec_Int_t *)0x0) {
    free(pVVar1);
  }
  if (p != (Rsb_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Rsb_ManFree( Rsb_Man_t * p )
{
    Vec_WrdFree( p->vCexes );
    Vec_IntFree( p->vDecPats );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vFaninsOld );
    Vec_IntFree( p->vTries );
    ABC_FREE( p );
}